

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int run_tests(int benchmark_output)

{
  int iVar1;
  bool local_39;
  task_entry_t *local_38;
  task_entry_t *task;
  int skip;
  int test_result;
  int current;
  int skipped;
  int failed;
  int passed;
  int total;
  int actual;
  int benchmark_output_local;
  
  passed = 0;
  failed = 0;
  for (local_38 = TASKS; local_38->main != (_func_int *)0x0; local_38 = local_38 + 1) {
    if (local_38->is_helper == 0) {
      failed = failed + 1;
    }
    passed = passed + 1;
  }
  local_39 = false;
  if (0 < passed) {
    iVar1 = strcmp(TASKS[0].task_name,"platform_output");
    local_39 = iVar1 == 0;
  }
  qsort(TASKS + (int)(uint)local_39,(long)(int)(passed - (uint)local_39),0x28,compare_task);
  fprintf(_stderr,"1..%d\n",(ulong)(uint)failed);
  fflush(_stderr);
  current = 0;
  skip = 1;
  for (local_38 = TASKS; local_38->main != (_func_int *)0x0; local_38 = local_38 + 1) {
    if (local_38->is_helper == 0) {
      iVar1 = run_test(local_38->task_name,benchmark_output,skip);
      if ((iVar1 != 0) && (iVar1 != 1)) {
        current = current + 1;
      }
      skip = skip + 1;
    }
  }
  return current;
}

Assistant:

int run_tests(int benchmark_output) {
  int actual;
  int total;
  int passed;
  int failed;
  int skipped;
  int current;
  int test_result;
  int skip;
  task_entry_t* task;

  /* Count the number of tests. */
  actual = 0;
  total = 0;
  for (task = TASKS; task->main; task++, actual++) {
    if (!task->is_helper) {
      total++;
    }
  }

  /* Keep platform_output first. */
  skip = (actual > 0 && 0 == strcmp(TASKS[0].task_name, "platform_output"));
  qsort(TASKS + skip, actual - skip, sizeof(TASKS[0]), compare_task);

  fprintf(stderr, "1..%d\n", total);
  fflush(stderr);

  /* Run all tests. */
  passed = 0;
  failed = 0;
  skipped = 0;
  current = 1;
  for (task = TASKS; task->main; task++) {
    if (task->is_helper) {
      continue;
    }

    test_result = run_test(task->task_name, benchmark_output, current);
    switch (test_result) {
    case TEST_OK: passed++; break;
    case TEST_SKIP: skipped++; break;
    default: failed++;
    }
    current++;
  }

  return failed;
}